

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O1

void __thiscall
Eigen::internal::
gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
::operator()(gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
             *this,double *blockA,const_blas_data_mapper<double,_long,_1> *lhs,long depth,long rows,
            long stride,long offset)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  undefined8 *puVar13;
  double *pdVar14;
  long lVar15;
  long lVar16;
  long m;
  double *pdVar17;
  ulong uVar18;
  double *pdVar19;
  long lVar20;
  double *pdVar21;
  double *pdVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  double *pdVar27;
  double *pdVar28;
  PacketBlock<__attribute__((__vector_size__(2_*_sizeof(double))))_double,_2> kernel;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  double *local_a8;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (stride != 0 || offset != 0) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x71c,
                  "void Eigen::internal::gemm_pack_lhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 1>, 4, 2, 1>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 1>, Pack1 = 4, Pack2 = 2, StorageOrder = 1, Conjugate = false, PanelMode = false]"
                 );
  }
  uVar9 = 4;
  lVar16 = 0;
  lVar20 = 0;
  do {
    lVar15 = rows - (rows - lVar20) % (long)uVar9;
    uVar25 = (uint)uVar9;
    if (lVar20 < lVar15) {
      local_d8 = lVar20 * 8;
      lVar12 = uVar9 * 8;
      local_c0 = lVar20 * 8 + 0x18;
      local_c8 = lVar20 * 8 + 0x10;
      local_d0 = lVar20 * 8 + 8;
      do {
        if (uVar9 == 1 || depth < 2) {
          lVar8 = 0;
        }
        else {
          pdVar14 = blockA + lVar16;
          lVar10 = 0;
          lVar8 = 0;
          do {
            uVar18 = 0;
            pdVar17 = pdVar14;
            lVar24 = local_d8;
            do {
              lVar23 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
              puVar13 = (undefined8 *)
                        ((long)(lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                        lVar23 * lVar24 + lVar10);
              lVar26 = 0;
              do {
                uVar5 = puVar13[1];
                *(undefined8 *)((long)&local_58 + lVar26) = *puVar13;
                *(undefined8 *)((long)&uStack_50 + lVar26) = uVar5;
                uVar7 = uStack_4c;
                uVar6 = uStack_50;
                lVar26 = lVar26 + 0x10;
                puVar13 = puVar13 + lVar23;
              } while (lVar26 == 0x10);
              uStack_50 = local_48;
              uStack_4c = uStack_44;
              local_48 = uVar6;
              uStack_44 = uVar7;
              lVar23 = 0;
              pdVar21 = pdVar17;
              do {
                dVar1 = *(double *)((long)&uStack_50 + lVar23);
                *pdVar21 = *(double *)((long)&local_58 + lVar23);
                pdVar21[1] = dVar1;
                lVar23 = lVar23 + 0x10;
                pdVar21 = pdVar21 + uVar9;
              } while (lVar23 == 0x10);
              uVar18 = uVar18 + 2;
              lVar24 = lVar24 + 0x10;
              pdVar17 = pdVar17 + 2;
            } while (uVar18 < uVar9);
            lVar16 = lVar16 + (ulong)(uVar25 * 2);
            lVar8 = lVar8 + 2;
            lVar10 = lVar10 + 0x10;
            pdVar14 = pdVar14 + uVar9 * 2;
          } while (lVar8 < (long)(depth - (depth >> 0x3f) & 0xfffffffffffffffeU));
        }
        if (lVar8 < depth) {
          local_a8 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data;
          lVar10 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
          pdVar21 = (double *)(lVar10 * local_d8 + (long)local_a8);
          pdVar17 = (double *)(lVar10 * local_c0 + (long)local_a8);
          pdVar14 = (double *)(lVar10 * local_c8 + (long)local_a8);
          pdVar27 = (double *)(lVar10 * local_d0 + (long)local_a8);
          local_a8 = local_a8 + lVar8;
          lVar24 = lVar8;
          do {
            if (uVar25 < 4) {
              uVar18 = 0;
            }
            else {
              uVar18 = 0;
              pdVar19 = pdVar14;
              pdVar11 = pdVar17;
              pdVar22 = pdVar21;
              pdVar28 = pdVar27;
              do {
                dVar1 = pdVar28[lVar8];
                dVar2 = pdVar19[lVar8];
                dVar3 = pdVar11[lVar8];
                blockA[lVar16 + uVar18] = pdVar22[lVar8];
                blockA[lVar16 + uVar18 + 1] = dVar1;
                blockA[lVar16 + uVar18 + 2] = dVar2;
                blockA[lVar16 + uVar18 + 3] = dVar3;
                uVar18 = uVar18 + 4;
                pdVar22 = pdVar22 + lVar10 * 4;
                pdVar11 = pdVar11 + lVar10 * 4;
                pdVar19 = pdVar19 + lVar10 * 4;
                pdVar28 = pdVar28 + lVar10 * 4;
              } while ((long)uVar18 < (long)(int)(uVar25 - 3));
              lVar16 = lVar16 + uVar18;
            }
            lVar23 = uVar9 - uVar18;
            if ((uVar18 <= uVar9 && lVar23 != 0) && (uVar9 & 3) != 0) {
              pdVar19 = (double *)((uVar18 + lVar20) * lVar10 * 8 + (long)local_a8);
              do {
                blockA[lVar16] = *pdVar19;
                lVar16 = lVar16 + 1;
                pdVar19 = pdVar19 + lVar10;
                lVar23 = lVar23 + -1;
              } while (lVar23 != 0);
            }
            lVar24 = lVar24 + 1;
            pdVar21 = pdVar21 + 1;
            pdVar17 = pdVar17 + 1;
            pdVar14 = pdVar14 + 1;
            pdVar27 = pdVar27 + 1;
            local_a8 = local_a8 + 1;
          } while (lVar24 != depth);
        }
        lVar20 = lVar20 + uVar9;
        local_d8 = local_d8 + lVar12;
        local_c0 = local_c0 + lVar12;
        local_c8 = local_c8 + lVar12;
        local_d0 = local_d0 + lVar12;
      } while (lVar20 < lVar15);
    }
    uVar4 = (uint)(uVar9 != 2) * 2;
    if (3 < uVar25) {
      uVar4 = uVar25 - 2;
    }
    uVar9 = (ulong)uVar4;
  } while (0 < (int)uVar4);
  if (lVar20 < rows) {
    lVar15 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
    pdVar14 = (double *)
              (lVar15 * 8 * lVar20 +
              (long)(lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data);
    do {
      if (0 < depth) {
        lVar12 = 0;
        do {
          blockA[lVar16 + lVar12] = pdVar14[lVar12];
          lVar12 = lVar12 + 1;
        } while (depth != lVar12);
        lVar16 = lVar16 + lVar12;
      }
      lVar20 = lVar20 + 1;
      pdVar14 = pdVar14 + lVar15;
    } while (lVar20 != rows);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_lhs<Scalar, Index, DataMapper, Pack1, Pack2, RowMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockA, const DataMapper& lhs, Index depth, Index rows, Index stride, Index offset)
{
  typedef typename packet_traits<Scalar>::type Packet;
  enum { PacketSize = packet_traits<Scalar>::size };

  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK LHS");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index count = 0;

//   const Index peeled_mc3 = Pack1>=3*PacketSize ? (rows/(3*PacketSize))*(3*PacketSize) : 0;
//   const Index peeled_mc2 = Pack1>=2*PacketSize ? peeled_mc3+((rows-peeled_mc3)/(2*PacketSize))*(2*PacketSize) : 0;
//   const Index peeled_mc1 = Pack1>=1*PacketSize ? (rows/(1*PacketSize))*(1*PacketSize) : 0;

  int pack = Pack1;
  Index i = 0;
  while(pack>0)
  {
    Index remaining_rows = rows-i;
    Index peeled_mc = i+(remaining_rows/pack)*pack;
    for(; i<peeled_mc; i+=pack)
    {
      if(PanelMode) count += pack * offset;

      const Index peeled_k = (depth/PacketSize)*PacketSize;
      Index k=0;
      if(pack>=PacketSize)
      {
        for(; k<peeled_k; k+=PacketSize)
        {
          for (Index m = 0; m < pack; m += PacketSize)
          {
            PacketBlock<Packet> kernel;
            for (int p = 0; p < PacketSize; ++p) kernel.packet[p] = lhs.loadPacket(i+p+m, k);
            ptranspose(kernel);
            for (int p = 0; p < PacketSize; ++p) pstore(blockA+count+m+(pack)*p, cj.pconj(kernel.packet[p]));
          }
          count += PacketSize*pack;
        }
      }
      for(; k<depth; k++)
      {
        Index w=0;
        for(; w<pack-3; w+=4)
        {
          Scalar a(cj(lhs(i+w+0, k))),
                 b(cj(lhs(i+w+1, k))),
                 c(cj(lhs(i+w+2, k))),
                 d(cj(lhs(i+w+3, k)));
          blockA[count++] = a;
          blockA[count++] = b;
          blockA[count++] = c;
          blockA[count++] = d;
        }
        if(pack%4)
          for(;w<pack;++w)
            blockA[count++] = cj(lhs(i+w, k));
      }

      if(PanelMode) count += pack * (stride-offset-depth);
    }

    pack -= PacketSize;
    if(pack<Pack2 && (pack+PacketSize)!=Pack2)
      pack = Pack2;
  }

  for(; i<rows; i++)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
      blockA[count++] = cj(lhs(i, k));
    if(PanelMode) count += (stride-offset-depth);
  }
}